

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# last.cpp
# Opt level: O0

void self_assign_test(bool verbose)

{
  bool bVar1;
  ostream *poVar2;
  string local_178;
  string local_158;
  allocator_type local_138;
  undefined1 local_130 [8];
  pstring astring;
  undefined1 local_108 [8];
  test_resource tpmr;
  Framer framer;
  bool verbose_local;
  
  Framer::Framer((Framer *)&tpmr.m_pmr_,"self assignment test",verbose);
  std::pmr::test_resource::test_resource((test_resource *)local_108,"stage7",verbose);
  std::pmr::test_resource::set_no_abort((test_resource *)local_108,true);
  std::pmr::polymorphic_allocator_P0339R5<std::byte>::polymorphic_allocator
            (&local_138,(memory_resource *)local_108);
  pstring::pstring((pstring *)local_130,"barfool",local_138);
  pstring::operator=((pstring *)local_130,(pstring *)local_130);
  pstring::str_abi_cxx11_(&local_158,(pstring *)local_130);
  bVar1 = std::operator!=(&local_158,"barfool");
  std::__cxx11::string::~string((string *)&local_158);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"astring.str()");
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"\"barfool\"");
    std::operator<<(poVar2,'\n');
    pstring::str_abi_cxx11_(&local_178,(pstring *)local_130);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_178);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"barfool");
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string((string *)&local_178);
    errorCount = errorCount + 1;
  }
  pstring::~pstring((pstring *)local_130);
  std::pmr::test_resource::~test_resource((test_resource *)local_108);
  Framer::~Framer((Framer *)&tpmr.m_pmr_);
  return;
}

Assistant:

void self_assign_test(bool verbose)
{
    Framer framer{ "self assignment test", verbose };

    std::pmr::test_resource tpmr{ "stage7", verbose };
    tpmr.set_no_abort(true);

    pstring astring{ "barfool", &tpmr };

    astring = astring;

    ASSERT_EQ(astring.str(), "barfool");
}